

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cpp
# Opt level: O2

void __thiscall File_Success_Test::TestBody(File_Success_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  long lVar3;
  AssertHelper local_a8;
  AssertionResult gtest_ar_1;
  AssertHelper local_90;
  vector<float,_std::allocator<float>_> floats;
  float expected [6];
  string fn;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&floats,"floatfile_good.txt",(allocator<char> *)expected);
  std::__cxx11::string::string((string *)&fn,(string *)&floats);
  std::__cxx11::string::~string((string *)&floats);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&floats,
             "1\n# comment 6632\n-2.5\n#6502\n3e2       -4.75E-1       5.25\n\n\n\n\n6\n",
             (allocator<char> *)&gtest_ar_1);
  bVar1 = pbrt::WriteFile(&fn,(string *)&floats);
  expected[0]._0_1_ = bVar1;
  expected[2] = 0.0;
  expected[3] = 0.0;
  std::__cxx11::string::~string((string *)&floats);
  if (expected[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&floats,(internal *)expected,
               (AssertionResult *)
               "WriteFile(fn, R\"(1\n# comment 6632\n-2.5\n#6502\n3e2       -4.75E-1       5.25\n\n\n\n\n6\n)\")"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/file_test.cpp"
               ,0x35,(char *)floats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&floats);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(expected + 2));
  pbrt::ReadFloatFile(&floats,&fn);
  local_a8.data_._0_4_ = 6;
  gtest_ar_1._0_8_ =
       (long)floats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)floats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)expected,"6","floats.size()",(int *)&local_a8,(unsigned_long *)&gtest_ar_1)
  ;
  if (expected[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (expected._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)expected._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/file_test.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(expected + 2));
  expected[4] = 5.25;
  expected[5] = 6.0;
  expected[0] = 1.0;
  expected[1] = -2.5;
  expected[2] = 300.0;
  expected[3] = -0.475;
  for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 4) {
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&gtest_ar_1,"expected[i]","floats[i]",(float *)((long)expected + lVar3),
               (float *)((long)floats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a8);
      pcVar2 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/file_test.cpp"
                 ,0x3b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
  }
  local_a8.data_._0_4_ = 0;
  local_90.data_._0_4_ = remove(fn._M_dataplus._M_p);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_1,"0","remove(fn.c_str())",(int *)&local_a8,(int *)&local_90);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/file_test.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&floats.super__Vector_base<float,_std::allocator<float>_>);
  std::__cxx11::string::~string((string *)&fn);
  return;
}

Assistant:

TEST(File, Success) {
    std::string fn = inTestDir("floatfile_good.txt");
    EXPECT_TRUE(WriteFile(fn, R"(1
# comment 6632
-2.5
#6502
3e2       -4.75E-1       5.25




6
)"));

    std::vector<float> floats = ReadFloatFile(fn);
    EXPECT_EQ(6, floats.size());
    const float expected[] = {1.f, -2.5f, 300.f, -.475f, 5.25f, 6.f};
    for (int i = 0; i < PBRT_ARRAYSIZE(expected); ++i)
        EXPECT_EQ(expected[i], floats[i]);

    EXPECT_EQ(0, remove(fn.c_str()));
}